

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall HighsLp::clear(HighsLp *this)

{
  HighsLp *in_RDI;
  
  in_RDI->num_col_ = 0;
  in_RDI->num_row_ = 0;
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f2229);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f2237);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f2245);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f2253);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f2261);
  HighsSparseMatrix::clear((HighsSparseMatrix *)in_RDI);
  in_RDI->sense_ = kMinimize;
  in_RDI->offset_ = 0.0;
  std::__cxx11::string::operator=((string *)&in_RDI->model_name_,"");
  std::__cxx11::string::operator=((string *)&in_RDI->objective_name_,"");
  in_RDI->new_col_name_ix_ = 0;
  in_RDI->new_row_name_ix_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4f22dc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4f22ed);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::clear
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x4f22fe);
  HighsNameHash::clear((HighsNameHash *)0x4f230f);
  HighsNameHash::clear((HighsNameHash *)0x4f2320);
  in_RDI->user_cost_scale_ = 0;
  in_RDI->user_bound_scale_ = 0;
  clearScale(in_RDI);
  in_RDI->is_scaled_ = false;
  in_RDI->is_moved_ = false;
  in_RDI->cost_row_location_ = -1;
  in_RDI->has_infinite_cost_ = false;
  HighsLpMods::clear((HighsLpMods *)in_RDI);
  return;
}

Assistant:

void HighsLp::clear() {
  this->num_col_ = 0;
  this->num_row_ = 0;

  this->col_cost_.clear();
  this->col_lower_.clear();
  this->col_upper_.clear();
  this->row_lower_.clear();
  this->row_upper_.clear();

  this->a_matrix_.clear();

  this->sense_ = ObjSense::kMinimize;
  this->offset_ = 0;

  this->model_name_ = "";
  this->objective_name_ = "";

  this->new_col_name_ix_ = 0;
  this->new_row_name_ix_ = 0;
  this->col_names_.clear();
  this->row_names_.clear();

  this->integrality_.clear();

  this->col_hash_.clear();
  this->row_hash_.clear();

  this->user_cost_scale_ = 0;
  this->user_bound_scale_ = 0;

  this->clearScale();
  this->is_scaled_ = false;
  this->is_moved_ = false;
  this->cost_row_location_ = -1;
  this->has_infinite_cost_ = false;
  this->mods_.clear();
}